

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O0

vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
* __thiscall
LongReadsMapper::filter_mappings_by_size_and_id(LongReadsMapper *this,int64_t size,float id)

{
  bool bVar1;
  size_t __new_size;
  reference pLVar2;
  long in_RDX;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *in_RSI;
  LongReadMapping *in_RDI;
  float in_XMM0_Da;
  LongReadMapping *m;
  const_iterator __end1;
  const_iterator __begin1;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *__range1;
  vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  *filtered_read_mappings;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *in_stack_ffffffffffffff88;
  LongReadMapping *__args;
  vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  *in_stack_ffffffffffffffb0;
  __normal_iterator<const_LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
  local_40;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *local_38;
  undefined1 local_1d;
  float local_1c;
  long local_18;
  
  local_1d = 0;
  __args = in_RDI;
  local_1c = in_XMM0_Da;
  local_18 = in_RDX;
  std::
  vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  ::vector((vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
            *)0x3f64aa);
  __new_size = LongReadsDatastore::size((LongReadsDatastore *)0x3f64b8);
  std::
  vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  ::resize(in_stack_ffffffffffffffb0,__new_size);
  local_38 = in_RSI + 2;
  local_40._M_current =
       (LongReadMapping *)
       std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::begin
                 (in_stack_ffffffffffffff88);
  std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::end(in_stack_ffffffffffffff88);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
                             *)in_stack_ffffffffffffff88), bVar1) {
    pLVar2 = __gnu_cxx::
             __normal_iterator<const_LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
             ::operator*(&local_40);
    if ((local_18 <= pLVar2->nEnd - pLVar2->nStart) &&
       (local_1c <= ((float)pLVar2->score * 100.0) / (float)(pLVar2->nEnd - pLVar2->nStart))) {
      std::
      vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
      ::operator[]((vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
                    *)in_RDI,(ulong)pLVar2->read_id);
      std::vector<LongReadMapping,std::allocator<LongReadMapping>>::
      emplace_back<LongReadMapping_const&>(in_RSI,__args);
    }
    __gnu_cxx::
    __normal_iterator<const_LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
    ::operator++(&local_40);
  }
  return (vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
          *)__args;
}

Assistant:

std::vector<std::vector<LongReadMapping>> LongReadsMapper::filter_mappings_by_size_and_id(int64_t size, float id) const {
    std::vector<std::vector<LongReadMapping>> filtered_read_mappings;
    filtered_read_mappings.resize(datastore.size()+1);
    for (auto &m:mappings){
        if (m.nEnd-m.nStart>=size and 100.0*m.score/(m.nEnd-m.nStart)>=id){
            filtered_read_mappings[m.read_id].emplace_back(m);
        }
    }
    return filtered_read_mappings;
}